

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_warm_start_y(OSQPWorkspace *work,c_float *y)

{
  c_float *in_RSI;
  long *in_RDI;
  c_int local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = _osqp_error(0,(char *)in_RSI);
  }
  else {
    if (*(long *)(in_RDI[0x17] + 0xa0) == 0) {
      *(undefined8 *)(in_RDI[0x17] + 0xa0) = 1;
    }
    prea_vec_copy(in_RSI,(c_float *)in_RDI[7],*(c_int *)(*in_RDI + 8));
    if (*(long *)(in_RDI[0x17] + 0x10) != 0) {
      vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x28),(c_float *)in_RDI[7],(c_float *)in_RDI[7],
                  *(c_int *)(*in_RDI + 8));
      vec_mult_scalar((c_float *)in_RDI[7],*(c_float *)in_RDI[0x18],*(c_int *)(*in_RDI + 8));
    }
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int osqp_warm_start_y(OSQPWorkspace *work, const c_float *y) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Update warm_start setting to true
  if (!work->settings->warm_start) work->settings->warm_start = 1;

  // Copy primal variable into the iterate y
  prea_vec_copy(y, work->y, work->data->m);

  // Scale iterate
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->Einv, work->y, work->y, work->data->m);
    vec_mult_scalar(work->y, work->scaling->c, work->data->m);
  }

  return 0;
}